

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O1

void __thiscall QPDF::removePage(QPDF *this,QPDFObjectHandle *page)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  long lVar3;
  int at;
  int iVar4;
  QPDFObjGen og;
  mapped_type *pmVar5;
  long lVar6;
  ulong uVar7;
  type ii;
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_int>_>,_std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_int>_>_>
  pVar8;
  QPDFObjectHandle kids;
  QPDFObjectHandle pages;
  string local_88;
  undefined1 local_68 [24];
  string local_50;
  
  og = QPDFObjectHandle::getObjGen(page);
  at = findPage(this,og);
  if ((at != 0) &&
     (_Var2._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl,
     uVar7 = ((long)*(pointer *)((long)&(_Var2._M_head_impl)->all_pages + 8) -
              *(long *)&((_Var2._M_head_impl)->all_pages).
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> >> 4
             ) - 1, (uVar7 & 0xffffffff80000000) != 0)) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar7);
  }
  getRoot((QPDF *)local_68);
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Pages","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_68 + 0x18),(string *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Kids","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_68,(string *)(local_68 + 0x18));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_68,at);
  iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_68);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Count","");
  QPDFObjectHandle::newInteger((QPDFObjectHandle *)&local_50.field_2,(long)iVar4);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)(local_68 + 0x18),&local_88,(QPDFObjectHandle *)&local_50.field_2);
  local_68._16_4_ = iVar4;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  uVar7 = (ulong)at;
  lVar6 = uVar7 * 0x10;
  local_68._20_4_ = at;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_erase
            (&(_Var2._M_head_impl)->all_pages,
             (QPDFObjectHandle *)
             (*(long *)&((_Var2._M_head_impl)->all_pages).
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> +
             lVar6));
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_88._M_dataplus._M_p = (pointer)QPDFObjectHandle::getObjGen(page);
  this_00 = &(_Var2._M_head_impl)->pageobj_to_pages_pos;
  pVar8 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
          ::equal_range(&this_00->_M_t,(key_type *)&local_88);
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
  if ((int)local_68._20_4_ < (int)local_68._16_4_) {
    do {
      _Var2._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      if ((long)uVar7 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error((int)uVar7);
      }
      lVar3 = *(long *)&((_Var2._M_head_impl)->all_pages).
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>;
      if ((ulong)((long)*(pointer *)((long)&(_Var2._M_head_impl)->all_pages + 8) - lVar3 >> 4) <=
          uVar7) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      local_88._M_dataplus._M_p =
           (pointer)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)(lVar3 + lVar6));
      pmVar5 = std::
               map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
               ::operator[](&((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                             pageobj_to_pages_pos,(key_type *)&local_88);
      *pmVar5 = (int)uVar7;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar4 != uVar7);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
  }
  return;
}

Assistant:

void
QPDF::removePage(QPDFObjectHandle page)
{
    int pos = findPage(page); // also ensures flat /Pages
    QTC::TC(
        "qpdf",
        "QPDF remove page",
        (pos == 0) ? 0 :                                // remove at beginning
            (pos == toI(m->all_pages.size() - 1)) ? 1   // end
                                                  : 2); // remove in middle

    QPDFObjectHandle pages = getRoot().getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");

    kids.eraseItem(pos);
    int npages = kids.getArrayNItems();
    pages.replaceKey("/Count", QPDFObjectHandle::newInteger(npages));
    m->all_pages.erase(m->all_pages.begin() + pos);
    m->pageobj_to_pages_pos.erase(page.getObjGen());
    for (int i = pos; i < npages; ++i) {
        insertPageobjToPage(m->all_pages.at(toS(i)), i, false);
    }
}